

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O3

int * Extra_VectorSupportArray(DdManager *dd,DdNode **F,int n,int *support)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = dd->size;
  if (dd->size < dd->sizeZ) {
    uVar1 = dd->sizeZ;
  }
  if (0 < (int)uVar1) {
    memset(support,0,(ulong)uVar1 << 2);
  }
  if (0 < n) {
    uVar2 = 0;
    do {
      ddSupportStep2((DdNode *)((ulong)F[uVar2] & 0xfffffffffffffffe),support);
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
    if (0 < n) {
      uVar2 = 0;
      do {
        ddClearFlag2((DdNode *)((ulong)F[uVar2] & 0xfffffffffffffffe));
        uVar2 = uVar2 + 1;
      } while ((uint)n != uVar2);
    }
  }
  return support;
}

Assistant:

int *
Extra_VectorSupportArray( 
  DdManager * dd, /* manager */ 
  DdNode ** F, /* array of DDs whose support is sought */ 
  int n, /* size of the array */  
  int * support ) /* array allocated by the user */
{
    int i, size;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax( dd->size, dd->sizeZ );
    for ( i = 0; i < size; i++ )
        support[i] = 0;

    /* Compute support and clean up markers. */
    for ( i = 0; i < n; i++ )
        ddSupportStep2( Cudd_Regular(F[i]), support );
    for ( i = 0; i < n; i++ )
        ddClearFlag2( Cudd_Regular(F[i]) );

    return support;
}